

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
::do_line(jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
          *this,quad<unsigned_char> *param_1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  pixel_type *ppVar4;
  pixel_type *ppVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  uint rc;
  uint rc_00;
  uint rc_01;
  uint rb;
  uint rb_00;
  int qs;
  uint ra;
  uint ra_00;
  uint ra_01;
  int qs_00;
  int qs_01;
  int qs_02;
  uint index;
  
  index = 0;
  while (index < this->width_) {
    ppVar4 = this->previous_line_;
    ppVar5 = this->current_line_;
    ra = (uint)ppVar5[(long)(int)index + -1].super_triplet<unsigned_char>.field_0.v1;
    ra_00 = (uint)ppVar5[(long)(int)index + -1].super_triplet<unsigned_char>.field_1.v2;
    ra_01 = (uint)ppVar5[(long)(int)index + -1].super_triplet<unsigned_char>.field_2.v3;
    bVar9 = ppVar5[(long)(int)index + -1].field_0.v4;
    bVar1 = ppVar4[(long)(int)index + -1].super_triplet<unsigned_char>.field_0.v1;
    rc = (uint)ppVar4[(long)(int)index + -1].super_triplet<unsigned_char>.field_1.v2;
    rc_00 = (uint)ppVar4[(long)(int)index + -1].super_triplet<unsigned_char>.field_2.v3;
    rc_01 = (uint)ppVar4[(long)(int)index + -1].field_0.v4;
    bVar6 = ppVar4[(int)index].super_triplet<unsigned_char>.field_0.v1;
    bVar7 = ppVar4[(int)index].super_triplet<unsigned_char>.field_1.v2;
    rb = (uint)ppVar4[(int)index].super_triplet<unsigned_char>.field_2.v3;
    rb_00 = (uint)ppVar4[(int)index].field_0.v4;
    bVar8 = ppVar4[(long)(int)index + 1].super_triplet<unsigned_char>.field_1.v2;
    bVar2 = ppVar4[(long)(int)index + 1].super_triplet<unsigned_char>.field_2.v3;
    bVar3 = ppVar4[(long)(int)index + 1].field_0.v4;
    iVar10 = quantize_gradient(this,(uint)ppVar4[(long)(int)index + 1].super_triplet<unsigned_char>.
                                          field_0.v1 - (uint)bVar6);
    iVar11 = quantize_gradient(this,(uint)bVar6 - (uint)bVar1);
    iVar12 = quantize_gradient(this,bVar1 - ra);
    qs = (iVar10 * 9 + iVar11) * 9 + iVar12;
    iVar10 = quantize_gradient(this,(uint)bVar8 - (uint)bVar7);
    iVar11 = quantize_gradient(this,bVar7 - rc);
    iVar12 = quantize_gradient(this,rc - ra_00);
    qs_02 = (iVar10 * 9 + iVar11) * 9 + iVar12;
    iVar10 = quantize_gradient(this,bVar2 - rb);
    iVar11 = quantize_gradient(this,rb - rc_00);
    iVar12 = quantize_gradient(this,rc_00 - ra_01);
    qs_01 = (iVar10 * 9 + iVar11) * 9 + iVar12;
    iVar10 = quantize_gradient(this,bVar3 - rb_00);
    iVar11 = quantize_gradient(this,rb_00 - rc_01);
    iVar12 = quantize_gradient(this,rc_01 - bVar9);
    qs_00 = (iVar10 * 9 + iVar11) * 9 + iVar12;
    if (((qs_02 == 0 && qs == 0) && qs_01 == 0) && qs_00 == 0) {
      iVar10 = do_run_mode(this,index,(encoder_strategy *)0x0);
      index = index + iVar10;
    }
    else {
      bVar8 = this->current_line_[(int)index].super_triplet<unsigned_char>.field_0.v1;
      iVar10 = get_predicted_value(ra,(uint)bVar6,(uint)bVar1);
      bVar6 = do_regular(this,qs,(uint)bVar8,iVar10,(encoder_strategy *)0x0);
      bVar1 = this->current_line_[(int)index].super_triplet<unsigned_char>.field_1.v2;
      iVar10 = get_predicted_value(ra_00,(uint)bVar7,rc);
      bVar7 = do_regular(this,qs_02,(uint)bVar1,iVar10,(encoder_strategy *)0x0);
      bVar1 = this->current_line_[(int)index].super_triplet<unsigned_char>.field_2.v3;
      iVar10 = get_predicted_value(ra_01,rb,rc_00);
      bVar8 = do_regular(this,qs_01,(uint)bVar1,iVar10,(encoder_strategy *)0x0);
      bVar1 = this->current_line_[(int)index].field_0.v4;
      iVar10 = get_predicted_value((uint)bVar9,rb_00,rc_01);
      bVar9 = do_regular(this,qs_00,(uint)bVar1,iVar10,(encoder_strategy *)0x0);
      this->current_line_[(int)index] =
           (pixel_type)((uint)bVar6 | (uint)bVar7 << 8 | (uint)bVar8 << 0x10 | (uint)bVar9 << 0x18);
      index = index + 1;
    }
  }
  return;
}

Assistant:

void do_line(quad<sample_type>* /*template_selector*/)
    {
        int32_t index{};
        while (static_cast<uint32_t>(index) < width_)
        {
            const quad<sample_type> ra{current_line_[index - 1]};
            const quad<sample_type> rc{previous_line_[index - 1]};
            const quad<sample_type> rb{previous_line_[index]};
            const quad<sample_type> rd{previous_line_[index + 1]};

            const int32_t qs1{compute_context_id(quantize_gradient(rd.v1 - rb.v1), quantize_gradient(rb.v1 - rc.v1),
                                                 quantize_gradient(rc.v1 - ra.v1))};
            const int32_t qs2{compute_context_id(quantize_gradient(rd.v2 - rb.v2), quantize_gradient(rb.v2 - rc.v2),
                                                 quantize_gradient(rc.v2 - ra.v2))};
            const int32_t qs3{compute_context_id(quantize_gradient(rd.v3 - rb.v3), quantize_gradient(rb.v3 - rc.v3),
                                                 quantize_gradient(rc.v3 - ra.v3))};
            const int32_t qs4{compute_context_id(quantize_gradient(rd.v4 - rb.v4), quantize_gradient(rb.v4 - rc.v4),
                                                 quantize_gradient(rc.v4 - ra.v4))};

            if (qs1 == 0 && qs2 == 0 && qs3 == 0 && qs4 == 0)
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
            }
            else
            {
                quad<sample_type> rx;
                rx.v1 = do_regular(qs1, current_line_[index].v1, get_predicted_value(ra.v1, rb.v1, rc.v1),
                                   static_cast<Strategy*>(nullptr));
                rx.v2 = do_regular(qs2, current_line_[index].v2, get_predicted_value(ra.v2, rb.v2, rc.v2),
                                   static_cast<Strategy*>(nullptr));
                rx.v3 = do_regular(qs3, current_line_[index].v3, get_predicted_value(ra.v3, rb.v3, rc.v3),
                                   static_cast<Strategy*>(nullptr));
                rx.v4 = do_regular(qs4, current_line_[index].v4, get_predicted_value(ra.v4, rb.v4, rc.v4),
                                   static_cast<Strategy*>(nullptr));
                current_line_[index] = rx;
                ++index;
            }
        }
    }